

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void __thiscall
fmt::v5::internal::
parse_format_string<true,wchar_t,fmt::v5::internal::format_string_checker<wchar_t,fmt::v5::internal::error_handler,wchar_t[3],int>&>
          (internal *this,basic_string_view<wchar_t> format_str,
          format_string_checker<wchar_t,_fmt::v5::internal::error_handler,_wchar_t[3],_int> *handler
          )

{
  parse_context_type *this_00;
  size_t *psVar1;
  internal *end;
  wchar_t *pwVar2;
  uint uVar3;
  wchar_t wVar4;
  internal *piVar5;
  internal *piVar6;
  internal *piVar7;
  format_string_checker<wchar_t,_fmt::v5::internal::error_handler,_wchar_t[3],_int> *pfVar8;
  char *message;
  bool bVar9;
  id_adapter<fmt::v5::internal::format_string_checker<wchar_t,_fmt::v5::internal::error_handler,_wchar_t[3],_int>_&,_wchar_t>
  local_38;
  
  pfVar8 = (format_string_checker<wchar_t,_fmt::v5::internal::error_handler,_wchar_t[3],_int> *)
           format_str.size_;
  end = this + (long)format_str.data_ * 4;
  this_00 = &pfVar8->context_;
  do {
    if (this == end) {
      return;
    }
    piVar6 = this;
    if (*(wchar_t *)this == L'{') {
LAB_001d30d7:
      piVar5 = this;
      if (this != piVar6) {
        do {
          bVar9 = piVar5 != piVar6;
          piVar7 = piVar5;
          if (bVar9) {
            wVar4 = *(wchar_t *)piVar5;
            while (wVar4 != L'}') {
              piVar7 = piVar7 + 4;
              bVar9 = piVar7 != piVar6;
              if (piVar7 == piVar6) goto LAB_001d3111;
              wVar4 = *(wchar_t *)piVar7;
            }
            bVar9 = true;
          }
LAB_001d3111:
          if (bVar9) {
            if ((piVar7 + 4 == piVar6) || (*(wchar_t *)(piVar7 + 4) != L'}')) {
              error_handler::on_error((error_handler *)this_00,"unmatched \'}\' in format string");
              goto LAB_001d3139;
            }
            piVar5 = piVar7 + 8;
            bVar9 = true;
          }
          else {
LAB_001d3139:
            bVar9 = false;
          }
        } while (bVar9);
      }
      piVar6 = piVar6 + 4;
      if (piVar6 == end) {
        message = "invalid format string";
        goto LAB_001d3178;
      }
      if ((char)*(wchar_t *)piVar6 == '}') {
        uVar3 = (pfVar8->context_).next_arg_id_;
        if ((int)uVar3 < 0) {
          error_handler::on_error
                    ((error_handler *)this_00,
                     "cannot switch from manual to automatic argument indexing");
          uVar3 = 0;
        }
        else {
          (pfVar8->context_).next_arg_id_ = uVar3 + 1;
        }
        pfVar8->arg_id_ = uVar3;
        if (1 < uVar3) {
          error_handler::on_error((error_handler *)this_00,"argument index out of range");
        }
      }
      else if (*(wchar_t *)piVar6 != L'{') {
        local_38.handler = pfVar8;
        piVar6 = (internal *)
                 parse_arg_id<wchar_t,fmt::v5::internal::id_adapter<fmt::v5::internal::format_string_checker<wchar_t,fmt::v5::internal::error_handler,wchar_t[3],int>&,wchar_t>>
                           ((wchar_t *)piVar6,(wchar_t *)end,&local_38);
        if (piVar6 == end) {
          wVar4 = L'\0';
        }
        else {
          wVar4 = *(wchar_t *)piVar6;
        }
        if (wVar4 != L'}') {
          if (wVar4 == L':') {
            piVar6 = piVar6 + 4;
            pwVar2 = (pfVar8->context_).format_str_.data_;
            (pfVar8->context_).format_str_.data_ = (wchar_t *)piVar6;
            psVar1 = &(pfVar8->context_).format_str_.size_;
            *psVar1 = *psVar1 - ((long)piVar6 - (long)pwVar2 >> 2);
            if ((ulong)pfVar8->arg_id_ < 2) {
              piVar6 = (internal *)(*pfVar8->parse_funcs_[pfVar8->arg_id_])(this_00);
            }
            if ((piVar6 != end) && (*(wchar_t *)piVar6 == L'}')) goto LAB_001d328c;
            message = "unknown format specifier";
          }
          else {
            message = "missing \'}\' in format string";
          }
LAB_001d3178:
          error_handler::on_error((error_handler *)this_00,message);
          goto LAB_001d31e2;
        }
      }
LAB_001d328c:
      this = piVar6 + 4;
      bVar9 = true;
    }
    else {
      bVar9 = true;
      wVar4 = *(wchar_t *)this;
      while (wVar4 != L'{') {
        piVar6 = piVar6 + 4;
        bVar9 = piVar6 != end;
        if (piVar6 == end) break;
        wVar4 = *(wchar_t *)piVar6;
      }
      piVar5 = this;
      if (bVar9) goto LAB_001d30d7;
      do {
        bVar9 = piVar5 != end;
        piVar6 = piVar5;
        if (bVar9) {
          wVar4 = *(wchar_t *)piVar5;
          while (wVar4 != L'}') {
            piVar6 = piVar6 + 4;
            bVar9 = piVar6 != end;
            if (piVar6 == end) goto LAB_001d31b4;
            wVar4 = *(wchar_t *)piVar6;
          }
          bVar9 = true;
        }
LAB_001d31b4:
        if (bVar9) {
          if ((piVar6 + 4 == end) || (*(wchar_t *)(piVar6 + 4) != L'}')) {
            error_handler::on_error((error_handler *)this_00,"unmatched \'}\' in format string");
            goto LAB_001d31dc;
          }
          piVar5 = piVar6 + 8;
          bVar9 = true;
        }
        else {
LAB_001d31dc:
          bVar9 = false;
        }
      } while (bVar9);
LAB_001d31e2:
      bVar9 = false;
    }
    if (!bVar9) {
      return;
    }
  } while( true );
}

Assistant:

FMT_CONSTEXPR void parse_format_string(
        basic_string_view<Char> format_str, Handler &&handler) {
  struct writer {
    FMT_CONSTEXPR void operator()(const Char *begin, const Char *end) {
      if (begin == end) return;
      for (;;) {
        const Char *p = FMT_NULL;
        if (!find<IS_CONSTEXPR>(begin, end, '}', p))
          return handler_.on_text(begin, end);
        ++p;
        if (p == end || *p != '}')
          return handler_.on_error("unmatched '}' in format string");
        handler_.on_text(begin, p);
        begin = p + 1;
      }
    }
    Handler &handler_;
  } write{handler};
  auto begin = format_str.data();
  auto end = begin + format_str.size();
  while (begin != end) {
    // Doing two passes with memchr (one for '{' and another for '}') is up to
    // 2.5x faster than the naive one-pass implementation on big format strings.
    const Char *p = begin;
    if (*begin != '{' && !find<IS_CONSTEXPR>(begin, end, '{', p))
      return write(begin, end);
    write(begin, p);
    ++p;
    if (p == end)
      return handler.on_error("invalid format string");
    if (static_cast<char>(*p) == '}') {
      handler.on_arg_id();
      handler.on_replacement_field(p);
    } else if (*p == '{') {
      handler.on_text(p, p + 1);
    } else {
      p = parse_arg_id(p, end, id_adapter<Handler, Char>{handler});
      Char c = p != end ? *p : Char();
      if (c == '}') {
        handler.on_replacement_field(p);
      } else if (c == ':') {
        p = handler.on_format_specs(p + 1, end);
        if (p == end || *p != '}')
          return handler.on_error("unknown format specifier");
      } else {
        return handler.on_error("missing '}' in format string");
      }
    }
    begin = p + 1;
  }
}